

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

ConstantValue * (anonymous_namespace)::evalLogicalOp<bool,bool>(BinaryOperator op,bool *l,bool *r)

{
  logic_t lVar1;
  byte *in_RDX;
  undefined4 in_ESI;
  ConstantValue *in_RDI;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  SVInt *in_stack_ffffffffffffff08;
  SVInt *in_stack_ffffffffffffff10;
  SVInt *this;
  logic_t local_59 [40];
  logic_t local_31;
  SVInt local_30 [3];
  
  switch(in_ESI) {
  case 0x13:
    slang::logic_t::logic_t(&local_31,*in_RDX & 1);
    slang::operator&&((logic_t)0x0,false);
    this = local_30;
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (bool)in_stack_fffffffffffffeff);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (SVInt *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    slang::SVInt::~SVInt(this);
    break;
  case 0x14:
    slang::logic_t::logic_t(local_59,*in_RDX & 1);
    slang::operator||((logic_t)0x0,false);
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (bool)in_stack_fffffffffffffeff);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (SVInt *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    break;
  case 0x15:
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (bool)in_stack_fffffffffffffeff);
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (bool)in_stack_fffffffffffffeff);
    lVar1 = slang::SVInt::logicalImpl
                      (in_stack_ffffffffffffff08,
                       (SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                         CONCAT16(in_stack_ffffffffffffff06,
                                                  in_stack_ffffffffffffff00)));
    slang::SVInt::SVInt(in_stack_ffffffffffffff08,
                        (logic_t)(uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38));
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(lVar1.value,CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (SVInt *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    break;
  case 0x16:
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (bool)in_stack_fffffffffffffeff);
    slang::SVInt::SVInt<bool>
              ((SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                 CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (bool)in_stack_fffffffffffffeff);
    lVar1 = slang::SVInt::logicalEquiv
                      (in_stack_ffffffffffffff08,
                       (SVInt *)CONCAT17(in_stack_ffffffffffffff07,
                                         CONCAT16(in_stack_ffffffffffffff06,
                                                  in_stack_ffffffffffffff00)));
    slang::SVInt::SVInt(in_stack_ffffffffffffff08,
                        (logic_t)(uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38));
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_ffffffffffffff07,CONCAT16(lVar1.value,in_stack_ffffffffffffff00)),
               (SVInt *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    slang::SVInt::~SVInt(in_stack_ffffffffffffff10);
    break;
  default:
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (nullptr_t)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  }
  return in_RDI;
}

Assistant:

ConstantValue evalLogicalOp(BinaryOperator op, const TL& l, const TR& r) {
    switch (op) {
        OP(LogicalAnd, SVInt(logic_t(l) && r));
        OP(LogicalOr, SVInt(logic_t(l) || r));
        OP(LogicalImplication, SVInt(SVInt::logicalImpl(l, r)));
        OP(LogicalEquivalence, SVInt(SVInt::logicalEquiv(l, r)));
        default:
            // This should only be reachable when speculatively
            // evaluating an expression that hasn't had its
            // type finalized via propagation, which can happen
            // during an analyzeOpTypes call.
            return nullptr;
    }
}